

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O0

void __thiscall ftxui::anon_unknown_3::ButtonBase::~ButtonBase(ButtonBase *this)

{
  ButtonBase *this_local;
  
  ~ButtonBase(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

ButtonBase(ConstStringRef label,
             std::function<void()> on_click,
             Ref<ButtonOption> option)
      : label_(label), on_click_(on_click), option_(std::move(option)) {}